

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  long lVar2;
  PCache *pCache;
  sqlite3_file *psVar3;
  sqlite3_io_methods *psVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Btree *p;
  BtShared *p_00;
  Pager *pPVar10;
  ulong uVar11;
  void *pvVar12;
  sqlite3_mutex *psVar13;
  sqlite3_mutex *psVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  Btree *pBVar18;
  code *pcVar19;
  Btree *pBVar20;
  int iVar21;
  uint uVar22;
  Btree *pBVar23;
  Btree *pBVar24;
  Btree **ppBVar25;
  BtShared **ppBVar26;
  u8 uVar27;
  char *pcVar28;
  byte bVar29;
  bool bVar30;
  bool bVar31;
  sqlite3_mutex *local_110;
  Pager *local_108;
  uint local_fc;
  char *local_e0;
  u8 local_d0;
  char *local_c8;
  uint local_9c;
  uchar zDbHeader [100];
  
  if (zFilename == (char *)0x0) {
LAB_0013200f:
    bVar30 = true;
    if (db->temp_store != '\x02') goto LAB_00132026;
LAB_00132019:
    local_fc = flags | 2;
    bVar15 = 1;
  }
  else {
    cVar1 = *zFilename;
    bVar30 = cVar1 == '\0';
    iVar5 = strcmp(zFilename,":memory:");
    if (iVar5 == 0) goto LAB_00132019;
    if (cVar1 == '\0') goto LAB_0013200f;
    bVar30 = false;
LAB_00132026:
    bVar15 = (byte)((vfsFlags & 0x80U) >> 7);
    local_fc = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar9 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar15 == 0 && !bVar30) {
    uVar9 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar9 = vfsFlags;
  }
  p = (Btree *)sqlite3MallocZero(0x48);
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->inTrans = '\0';
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar30) && ((uVar9 >> 0x11 & 1) != 0 && ((uVar9 & 0x40) == 0 & bVar15) == 0)) {
    iVar5 = sqlite3Strlen30(zFilename);
    uVar7 = iVar5 + 1;
    uVar6 = pVfs->mxPathname + 1;
    uVar22 = uVar7;
    if ((int)uVar7 < (int)uVar6) {
      uVar22 = uVar6;
    }
    pcVar28 = (char *)sqlite3Malloc((ulong)uVar22);
    p->sharable = '\x01';
    if (pcVar28 == (char *)0x0) {
      sqlite3_free(p);
      return 7;
    }
    if (bVar15 == 0) {
      *pcVar28 = '\0';
      iVar5 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar6,pcVar28);
      if (iVar5 != 0) {
        sqlite3_free(pcVar28);
        sqlite3_free(p);
        return iVar5;
      }
    }
    else {
      memcpy(pcVar28,zFilename,(ulong)uVar7);
    }
    bVar30 = true;
    if (sqlite3Config.bCoreMutex == 0) {
      psVar13 = (sqlite3_mutex *)0x0;
      bVar31 = true;
      local_110 = (sqlite3_mutex *)0x0;
    }
    else {
      local_110 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      bVar31 = local_110 == (sqlite3_mutex *)0x0;
      if (!bVar31) {
        (*sqlite3Config.mutex.xMutexEnter)(local_110);
      }
      if ((sqlite3Config.bCoreMutex == 0) ||
         (psVar13 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar13 == (sqlite3_mutex *)0x0)) {
        psVar13 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar13);
        bVar30 = false;
      }
    }
    ppBVar26 = &sqlite3SharedCacheList;
LAB_0013261e:
    p_00 = *ppBVar26;
    if (p_00 != (BtShared *)0x0) {
      pPVar10 = p_00->pPager;
      iVar5 = strcmp(pcVar28,pPVar10->zFilename);
      if ((iVar5 != 0) || (pPVar10->pVfs != pVfs)) goto LAB_0013264a;
      uVar11 = (ulong)(uint)db->nDb;
      lVar16 = uVar11 * 0x20 + -0x18;
      for (; 0 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
        lVar2 = *(long *)((long)&db->aDb->zDbSName + lVar16);
        if ((lVar2 != 0) && (*(BtShared **)(lVar2 + 8) == p_00)) {
          if (!bVar30) {
            (*sqlite3Config.mutex.xMutexLeave)(psVar13);
          }
          if (!bVar31) {
            (*sqlite3Config.mutex.xMutexLeave)(local_110);
          }
          sqlite3_free(pcVar28);
          sqlite3_free(p);
          return 0x13;
        }
        lVar16 = lVar16 + -0x20;
      }
      p->pBt = p_00;
      p_00->nRef = p_00->nRef + 1;
    }
    if (!bVar30) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar13);
    }
    sqlite3_free(pcVar28);
    if (p_00 == (BtShared *)0x0) goto LAB_001320bd;
    goto LAB_001326c1;
  }
  local_110 = (sqlite3_mutex *)0x0;
LAB_001320bd:
  p_00 = (BtShared *)sqlite3MallocZero(0x88);
  if (p_00 == (BtShared *)0x0) {
    iVar5 = 7;
  }
  else {
    zDbHeader[0] = '\0';
    zDbHeader[1] = '\x10';
    zDbHeader[2] = '\0';
    zDbHeader[3] = '\0';
    iVar21 = 0x58;
    if (0x58 < pVfs->szOsFile) {
      iVar21 = pVfs->szOsFile;
    }
    p_00->pPager = (Pager *)0x0;
    uVar22 = local_fc & 2;
    local_c8 = zFilename;
    if (uVar22 == 0) {
      if (zFilename == (char *)0x0) {
        local_c8 = (char *)0x0;
        bVar30 = true;
LAB_001323bc:
        local_d0 = '\0';
        goto LAB_001323e0;
      }
      if (*zFilename == '\0') {
        bVar30 = false;
        goto LAB_001323bc;
      }
      iVar5 = pVfs->mxPathname;
      pPVar10 = (Pager *)sqlite3Malloc((long)iVar5 * 2 + 2);
      if (pPVar10 == (Pager *)0x0) goto LAB_001325f8;
      *(char *)&pPVar10->pVfs = '\0';
      iVar5 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar5 + 1,(char *)pPVar10);
      uVar6 = sqlite3Strlen30((char *)pPVar10);
      uVar7 = sqlite3Strlen30(zFilename);
      local_e0 = zFilename + (ulong)uVar7 + 1;
      for (pcVar28 = local_e0; *pcVar28 != '\0'; pcVar28 = pcVar28 + (ulong)uVar8 + (ulong)uVar7 + 2
          ) {
        uVar7 = sqlite3Strlen30(pcVar28);
        uVar8 = sqlite3Strlen30(pcVar28 + (ulong)uVar7 + 1);
      }
      if (iVar5 == 0) {
        if ((int)(uVar6 + 8) <= pVfs->mxPathname) {
          iVar5 = ((int)pcVar28 - (int)local_e0) + 1;
          bVar30 = false;
          local_d0 = '\0';
          local_108 = pPVar10;
          goto LAB_001323f7;
        }
        iVar5 = sqlite3CantopenError(0xd85e);
      }
LAB_00132922:
      sqlite3_free(pPVar10);
    }
    else {
      if (zFilename == (char *)0x0) {
        local_d0 = '\x01';
        local_c8 = (char *)0x0;
        bVar30 = true;
LAB_001323e0:
        local_108 = (Pager *)0x0;
        uVar6 = 0;
        local_e0 = (char *)0x0;
        iVar5 = 0;
      }
      else {
        if (*zFilename == '\0') {
          local_d0 = '\x01';
          bVar30 = false;
          goto LAB_001323e0;
        }
        iVar5 = 0;
        local_108 = (Pager *)sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
        if (local_108 == (Pager *)0x0) goto LAB_001325f8;
        uVar6 = sqlite3Strlen30((char *)local_108);
        bVar30 = true;
        local_c8 = (char *)0x0;
        local_d0 = '\x01';
        local_e0 = (char *)0x0;
      }
LAB_001323f7:
      uVar17 = (ulong)uVar6;
      uVar11 = (ulong)(iVar21 + 7U & 0x7ffffff8);
      pPVar10 = (Pager *)sqlite3MallocZero(((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) +
                                           uVar17 * 3 + uVar11 * 2 + (long)iVar5 + 0x189);
      if (pPVar10 == (Pager *)0x0) {
        sqlite3DbFree((sqlite3 *)0x0,local_108);
LAB_001325f8:
        iVar5 = 7;
        goto LAB_0013292c;
      }
      pPVar10->pPCache = (PCache *)(pPVar10 + 1);
      pPVar10->fd = (sqlite3_file *)&pPVar10[1].fd;
      pcVar28 = pPVar10[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40);
      pPVar10->sjfd = (sqlite3_file *)pcVar28;
      pPVar10->jfd = (sqlite3_file *)(pcVar28 + uVar11);
      pcVar28 = pcVar28 + uVar11 + uVar11;
      pPVar10->zFilename = pcVar28;
      if (local_108 != (Pager *)0x0) {
        pPVar10->zJournal = pcVar28 + (int)(iVar5 + uVar6 + 1);
        memcpy(pcVar28,local_108,uVar17);
        if (iVar5 != 0) {
          memcpy(pPVar10->zFilename + (uVar6 + 1),local_e0,(long)iVar5);
        }
        memcpy(pPVar10->zJournal,local_108,uVar17);
        builtin_strncpy(pPVar10->zJournal + uVar17,"-journal",9);
        (pPVar10->zJournal + uVar17 + 8)[1] = '\0';
        pPVar10->zWal = pPVar10->zJournal + uVar17 + 9;
        memcpy(pPVar10->zJournal + uVar17 + 9,local_108,uVar17);
        builtin_strncpy(pPVar10->zWal + uVar17,"-wal",5);
        sqlite3_free(local_108);
      }
      pPVar10->pVfs = pVfs;
      pPVar10->vfsFlags = uVar9;
      if ((!bVar30) && (*local_c8 != '\0')) {
        local_9c = 0;
        iVar5 = (*pVfs->xOpen)(pVfs,pPVar10->zFilename,pPVar10->fd,uVar9 & 0x87f7f,(int *)&local_9c)
        ;
        if (iVar5 == 0) {
          uVar6 = local_9c & 1;
          bVar29 = (byte)uVar6;
          uVar9 = (*pPVar10->fd->pMethods->xDeviceCharacteristics)(pPVar10->fd);
          if (uVar6 == 0) {
            setSectorSize(pPVar10);
            uVar6 = pPVar10->sectorSize;
            if (0x1000 < uVar6) {
              if (uVar6 < 0x2001) {
                zDbHeader[0] = (char)uVar6;
                zDbHeader[1] = (char)(uVar6 >> 8);
                zDbHeader[2] = (char)(uVar6 >> 0x10);
                zDbHeader[3] = (char)(uVar6 >> 0x18);
              }
              else {
                zDbHeader[0] = '\0';
                zDbHeader[1] = ' ';
                zDbHeader[2] = '\0';
                zDbHeader[3] = '\0';
              }
            }
          }
          iVar5 = sqlite3_uri_boolean(local_c8,"nolock",0);
          pPVar10->noLock = (u8)iVar5;
          if (((uVar9 >> 0xd & 1) != 0) ||
             (iVar5 = sqlite3_uri_boolean(local_c8,"immutable",0), iVar5 != 0)) {
            uVar9 = 1;
            goto LAB_0013285a;
          }
          bVar30 = true;
          uVar27 = '\0';
          goto LAB_0013286d;
        }
LAB_001328fa:
        psVar3 = pPVar10->fd;
        if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar3->pMethods->xClose)(psVar3);
          psVar3->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar10->pTmpSpace);
        goto LAB_00132922;
      }
LAB_0013285a:
      pPVar10->eState = '\x01';
      pPVar10->eLock = '\x04';
      pPVar10->noLock = '\x01';
      bVar29 = (byte)uVar9 & 1;
      uVar27 = '\x01';
      bVar30 = false;
LAB_0013286d:
      iVar5 = sqlite3PagerSetPagesize(pPVar10,(u32 *)zDbHeader,-1);
      if (iVar5 != 0) goto LAB_001328fa;
      pcVar19 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
      if (uVar22 == 0) {
        pcVar19 = pagerStress;
      }
      pCache = pPVar10->pPCache;
      pCache->szSpill = 0;
      pCache->szPage = 0;
      pCache->szExtra = 0;
      pCache->bPurgeable = '\0';
      pCache->eCreate = '\0';
      *(undefined2 *)&pCache->field_0x2e = 0;
      pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
      pCache->pStress = (void *)0x0;
      pCache->pSynced = (PgHdr *)0x0;
      pCache->nRefSum = 0;
      pCache->szCache = 0;
      pCache->pDirty = (PgHdr *)0x0;
      pCache->pDirtyTail = (PgHdr *)0x0;
      pCache->pCache = (sqlite3_pcache *)0x0;
      pCache->szExtra = 0x88;
      pCache->bPurgeable = (byte)(uVar22 >> 1) ^ 1;
      pCache->eCreate = '\x02';
      pCache->xStress = pcVar19;
      pCache->pStress = pPVar10;
      pCache->szCache = 100;
      pCache->szSpill = 1;
      pCache->szPage = 1;
      iVar5 = sqlite3PcacheSetPageSize(pCache,zDbHeader._0_4_);
      if (iVar5 != 0) goto LAB_001328fa;
      pPVar10->useJournal = (byte)(local_fc & 1) ^ 1;
      pPVar10->mxPgno = 0x3fffffff;
      pPVar10->tempFile = uVar27;
      pPVar10->exclusiveMode = uVar27;
      pPVar10->changeCountDone = uVar27;
      pPVar10->memDb = local_d0;
      pPVar10->readOnly = bVar29;
      pPVar10->noSync = uVar27;
      if (bVar30) {
        pPVar10->fullSync = '\x01';
        pPVar10->extraSync = '\0';
        pPVar10->syncFlags = '\x02';
        pPVar10->walSyncFlags = '\n';
      }
      pPVar10->nExtra = 0x88;
      pPVar10->journalSizeLimit = -1;
      setSectorSize(pPVar10);
      if ((local_fc & 3) != 0) {
        pPVar10->journalMode = ((local_fc & 1) == 0) * '\x02' + '\x02';
      }
      pPVar10->xReiniter = pageReinit;
      setGetterMethod(pPVar10);
      p_00->pPager = pPVar10;
      pPVar10->szMmap = db->szMmap;
      pagerFixMaplimit(pPVar10);
      zDbHeader[0x50] = '\0';
      zDbHeader[0x51] = '\0';
      zDbHeader[0x52] = '\0';
      zDbHeader[0x53] = '\0';
      zDbHeader[0x54] = '\0';
      zDbHeader[0x55] = '\0';
      zDbHeader[0x56] = '\0';
      zDbHeader[0x57] = '\0';
      zDbHeader[0x58] = '\0';
      zDbHeader[0x59] = '\0';
      zDbHeader[0x5a] = '\0';
      zDbHeader[0x5b] = '\0';
      zDbHeader[0x5c] = '\0';
      zDbHeader[0x5d] = '\0';
      zDbHeader[0x5e] = '\0';
      zDbHeader[0x5f] = '\0';
      zDbHeader[0x40] = '\0';
      zDbHeader[0x41] = '\0';
      zDbHeader[0x42] = '\0';
      zDbHeader[0x43] = '\0';
      zDbHeader[0x44] = '\0';
      zDbHeader[0x45] = '\0';
      zDbHeader[0x46] = '\0';
      zDbHeader[0x47] = '\0';
      zDbHeader[0x48] = '\0';
      zDbHeader[0x49] = '\0';
      zDbHeader[0x4a] = '\0';
      zDbHeader[0x4b] = '\0';
      zDbHeader[0x4c] = '\0';
      zDbHeader[0x4d] = '\0';
      zDbHeader[0x4e] = '\0';
      zDbHeader[0x4f] = '\0';
      zDbHeader[0x30] = '\0';
      zDbHeader[0x31] = '\0';
      zDbHeader[0x32] = '\0';
      zDbHeader[0x33] = '\0';
      zDbHeader[0x34] = '\0';
      zDbHeader[0x35] = '\0';
      zDbHeader[0x36] = '\0';
      zDbHeader[0x37] = '\0';
      zDbHeader[0x38] = '\0';
      zDbHeader[0x39] = '\0';
      zDbHeader[0x3a] = '\0';
      zDbHeader[0x3b] = '\0';
      zDbHeader[0x3c] = '\0';
      zDbHeader[0x3d] = '\0';
      zDbHeader[0x3e] = '\0';
      zDbHeader[0x3f] = '\0';
      zDbHeader[0x20] = '\0';
      zDbHeader[0x21] = '\0';
      zDbHeader[0x22] = '\0';
      zDbHeader[0x23] = '\0';
      zDbHeader[0x24] = '\0';
      zDbHeader[0x25] = '\0';
      zDbHeader[0x26] = '\0';
      zDbHeader[0x27] = '\0';
      zDbHeader[0x28] = '\0';
      zDbHeader[0x29] = '\0';
      zDbHeader[0x2a] = '\0';
      zDbHeader[0x2b] = '\0';
      zDbHeader[0x2c] = '\0';
      zDbHeader[0x2d] = '\0';
      zDbHeader[0x2e] = '\0';
      zDbHeader[0x2f] = '\0';
      zDbHeader[0x10] = '\0';
      zDbHeader[0x11] = '\0';
      zDbHeader[0x12] = '\0';
      zDbHeader[0x13] = '\0';
      zDbHeader[0x14] = '\0';
      zDbHeader[0x15] = '\0';
      zDbHeader[0x16] = '\0';
      zDbHeader[0x17] = '\0';
      zDbHeader[0x18] = '\0';
      zDbHeader[0x19] = '\0';
      zDbHeader[0x1a] = '\0';
      zDbHeader[0x1b] = '\0';
      zDbHeader[0x1c] = '\0';
      zDbHeader[0x1d] = '\0';
      zDbHeader[0x1e] = '\0';
      zDbHeader[0x1f] = '\0';
      zDbHeader[0x60] = '\0';
      zDbHeader[0x61] = '\0';
      zDbHeader[0x62] = '\0';
      zDbHeader[99] = '\0';
      zDbHeader[0] = '\0';
      zDbHeader[1] = '\0';
      zDbHeader[2] = '\0';
      zDbHeader[3] = '\0';
      zDbHeader[4] = '\0';
      zDbHeader[5] = '\0';
      zDbHeader[6] = '\0';
      zDbHeader[7] = '\0';
      zDbHeader[8] = '\0';
      zDbHeader[9] = '\0';
      zDbHeader[10] = '\0';
      zDbHeader[0xb] = '\0';
      zDbHeader[0xc] = '\0';
      zDbHeader[0xd] = '\0';
      zDbHeader[0xe] = '\0';
      zDbHeader[0xf] = '\0';
      psVar3 = p_00->pPager->fd;
      psVar4 = psVar3->pMethods;
      if (((psVar4 == (sqlite3_io_methods *)0x0) ||
          (iVar5 = (*psVar4->xRead)(psVar3,zDbHeader,100,0), iVar5 == 0x20a)) || (iVar5 == 0)) {
        p_00->openFlags = (u8)local_fc;
        p_00->db = db;
        pPVar10 = p_00->pPager;
        pPVar10->xBusyHandler = btreeInvokeBusyHandler;
        pPVar10->pBusyHandlerArg = p_00;
        psVar4 = pPVar10->fd->pMethods;
        if (psVar4 != (sqlite3_io_methods *)0x0) {
          (*psVar4->xFileControl)(pPVar10->fd,0xf,&pPVar10->xBusyHandler);
          pPVar10 = p_00->pPager;
        }
        p->pBt = p_00;
        p_00->pCursor = (BtCursor *)0x0;
        p_00->pPage1 = (MemPage *)0x0;
        if (pPVar10->readOnly != '\0') {
          *(byte *)&p_00->btsFlags = (byte)p_00->btsFlags | 1;
        }
        iVar5 = (int)((zDbHeader._16_8_ & 0xff) << 8);
        uVar9 = (uint)zDbHeader[0x11] * 0x10000 + iVar5;
        p_00->pageSize = uVar9;
        if (((iVar5 + (uint)zDbHeader[0x11] * 0x10000) - 0x10001 < 0xffff01ff) ||
           ((uVar9 + 0x1ffff & uVar9) != 0)) {
          p_00->pageSize = 0;
          uVar9 = 0;
          if (zFilename != (char *)0x0 && bVar15 == 0) {
            p_00->autoVacuum = '\0';
            p_00->incrVacuum = '\0';
            uVar9 = 0;
          }
        }
        else {
          uVar9 = (uint)zDbHeader[0x14];
          p_00->btsFlags = p_00->btsFlags | 2;
          p_00->autoVacuum =
               (((uint)zDbHeader._52_4_ >> 0x18 != 0 || (zDbHeader._48_8_ & 0xff000000000000) != 0)
               || (zDbHeader._48_8_ & 0xff0000000000) != 0) ||
               (zDbHeader._48_8_ & 0xff00000000) != 0;
          p_00->incrVacuum =
               (((uint)zDbHeader._64_4_ >> 0x18 != 0 || (zDbHeader._64_8_ & 0xff0000) != 0) ||
               (zDbHeader._64_8_ & 0xff00) != 0) || (zDbHeader._64_8_ & 0xff) != 0;
        }
        iVar5 = sqlite3PagerSetPagesize(pPVar10,&p_00->pageSize,uVar9);
        if (iVar5 == 0) {
          p_00->usableSize = p_00->pageSize - uVar9;
          p_00->nRef = 1;
          if (p->sharable != '\0') {
            if (sqlite3Config.bCoreMutex != 0) {
              psVar13 = (*sqlite3Config.mutex.xMutexAlloc)(2);
              if (sqlite3Config.bCoreMutex != 0) {
                psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                p_00->mutex = psVar14;
                if (psVar14 == (sqlite3_mutex *)0x0) {
                  iVar5 = 7;
                  goto LAB_0013292c;
                }
              }
              if (psVar13 != (sqlite3_mutex *)0x0) {
                (*sqlite3Config.mutex.xMutexEnter)(psVar13);
                p_00->pNext = sqlite3SharedCacheList;
                sqlite3SharedCacheList = p_00;
                (*sqlite3Config.mutex.xMutexLeave)(psVar13);
                goto LAB_001326c1;
              }
            }
            p_00->pNext = sqlite3SharedCacheList;
            sqlite3SharedCacheList = p_00;
          }
LAB_001326c1:
          if (p->sharable != '\0') {
            uVar17 = 0;
            uVar11 = (ulong)(uint)db->nDb;
            if (db->nDb < 1) {
              uVar11 = uVar17;
            }
            for (; uVar11 * 0x20 != uVar17; uVar17 = uVar17 + 0x20) {
              pBVar24 = *(Btree **)((long)&db->aDb->pBt + uVar17);
              if ((pBVar24 != (Btree *)0x0) && (pBVar24->sharable != '\0')) goto LAB_00132707;
            }
          }
          goto LAB_001327c9;
        }
      }
    }
LAB_0013292c:
    if (p_00->pPager != (Pager *)0x0) {
      sqlite3PagerClose(p_00->pPager,(sqlite3 *)0x0);
    }
  }
  sqlite3_free(p_00);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
LAB_0013295a:
  if (local_110 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_110);
  }
  return iVar5;
LAB_0013264a:
  ppBVar26 = &p_00->pNext;
  goto LAB_0013261e;
LAB_00132707:
  do {
    pBVar20 = pBVar24;
    pBVar24 = pBVar20->pPrev;
  } while (pBVar20->pPrev != (Btree *)0x0);
  lVar16 = 0x20;
  if (p->pBt < pBVar20->pBt) {
    ppBVar25 = &pBVar20->pPrev;
    pBVar18 = (Btree *)0x0;
    pBVar24 = p;
  }
  else {
    do {
      pBVar23 = pBVar20;
      pBVar24 = pBVar23->pNext;
      if (pBVar24 == (Btree *)0x0) {
        ppBVar25 = &pBVar23->pNext;
        pBVar20 = (Btree *)0x0;
        pBVar18 = pBVar23;
        pBVar24 = p;
        goto LAB_001327be;
      }
      pBVar20 = pBVar24;
    } while (pBVar24->pBt < p->pBt);
    ppBVar25 = &pBVar23->pNext;
    p->pNext = pBVar24;
    lVar16 = 0x28;
    pBVar18 = p;
    pBVar20 = pBVar23;
  }
LAB_001327be:
  *(Btree **)((long)&p->db + lVar16) = pBVar20;
  pBVar24->pPrev = pBVar18;
  *ppBVar25 = p;
LAB_001327c9:
  *ppBtree = p;
  iVar5 = 0;
  pvVar12 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar12 == (void *)0x0) {
    sqlite3PagerSetCachesize(p->pBt->pPager,-2000);
  }
  psVar3 = p_00->pPager->fd;
  psVar4 = psVar3->pMethods;
  if (psVar4 != (sqlite3_io_methods *)0x0) {
    (*psVar4->xFileControl)(psVar3,0x1e,&p_00->db);
  }
  goto LAB_0013295a;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyHandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}